

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

void __thiscall
LTOnlineChannel::LTOnlineChannel(LTOnlineChannel *this,dataRefsLT ch,LTChannelType t,char *chName)

{
  char *pcVar1;
  
  (this->super_LTChannel).urlLink._M_dataplus._M_p =
       (pointer)&(this->super_LTChannel).urlLink.field_2;
  (this->super_LTChannel).urlLink._M_string_length = 0;
  (this->super_LTChannel).urlLink.field_2._M_local_buf[0] = '\0';
  (this->super_LTChannel).urlName._M_dataplus._M_p =
       (pointer)&(this->super_LTChannel).urlName.field_2;
  (this->super_LTChannel).urlName._M_string_length = 0;
  (this->super_LTChannel).urlName.field_2._M_local_buf[0] = '\0';
  (this->super_LTChannel).urlPopup._M_dataplus._M_p =
       (pointer)&(this->super_LTChannel).urlPopup.field_2;
  (this->super_LTChannel).urlPopup._M_string_length = 0;
  (this->super_LTChannel).urlPopup.field_2._M_local_buf[0] = '\0';
  (this->super_LTChannel).pszChName = chName;
  (this->super_LTChannel).channel = ch;
  (this->super_LTChannel).eType = t;
  (this->super_LTChannel).thr._M_id._M_thread = 0;
  (this->super_LTChannel).tNextWakeup.__d.__r = 0;
  (this->super_LTChannel).eThrStatus = THR_NONE;
  (this->super_LTChannel).bValid = true;
  (this->super_LTChannel).errCnt = 0;
  (this->super_LTChannel)._vptr_LTChannel = (_func_int **)&PTR__LTOnlineChannel_002deae8;
  this->pCurl = (CURL *)0x0;
  (this->requBody)._M_dataplus._M_p = (pointer)&(this->requBody).field_2;
  (this->requBody)._M_string_length = 0;
  (this->requBody).field_2._M_local_buf[0] = '\0';
  pcVar1 = (char *)malloc(0x4000);
  this->netData = pcVar1;
  this->netDataPos = 0;
  this->netDataSize = 0x4000;
  memset(this->curl_errtxt,0,0x100);
  this->httpResponse = 200;
  InitCurl(this);
  return;
}

Assistant:

LTOnlineChannel::LTOnlineChannel (dataRefsLT ch, LTChannelType t, const char* chName) :
LTChannel(ch, t, chName),
pCurl(NULL),
netData((char*)malloc(CURL_MAX_WRITE_SIZE)),      // initial buffer allocation
netDataPos(0), netDataSize(CURL_MAX_WRITE_SIZE),
curl_errtxt{0}, httpResponse(HTTP_OK)
{
    // initialize a CURL handle (sets invalid if it fails)
    InitCurl();
}